

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::UniformLoc::Run(UniformLoc *this)

{
  long lVar1;
  DefOccurence local_2c0;
  DefOccurence local_2bc;
  LayoutSpecifierBase local_2b8;
  LayoutSpecifierBase local_2a8;
  UniformType local_290;
  Uniform local_200;
  undefined1 local_28 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformLoc *this_local;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_28);
  UniformType::UniformType(&local_290,0x8b52,0);
  local_2b8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(2,Dec);
  local_2a8 = local_2b8;
  DefOccurence::DefOccurence(&local_2bc,FSH_OR_CSH);
  DefOccurence::DefOccurence(&local_2c0,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_200,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_290,(Loc)local_2a8,local_2bc,local_2c0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_200);
  anon_unknown_0::Uniform::~Uniform(&local_200);
  UniformType::~UniformType(&local_290);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_28);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_28);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//layout (location = 2) uniform vec4 u0;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, GL_FLOAT_VEC4, Loc::C(2), DefOccurence::FSH_OR_CSH));
		return doRun(uniforms);
	}